

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdgesInternal
          (S2ClosestEdgeQueryBase<S2MaxDistance> *this,Target *target,Options *options)

{
  size_type *this_00;
  S2ShapeIndex *pSVar1;
  Target *pTVar2;
  Options *pOVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  reference piVar8;
  S2MaxDistance SVar9;
  S2MaxDistance SVar10;
  Delta delta;
  iterator iVar11;
  bool local_2a3;
  bool local_2a2;
  bool local_2a1;
  byte local_292;
  bool local_229;
  int min_optimized_edges;
  double local_1b8;
  double local_1b0;
  S1ChordAngle local_1a8;
  byte local_19d;
  uint local_19c;
  bool target_uses_max_error;
  S2MaxDistance SStack_198;
  S2MaxDistance local_190;
  S1ChordAngle local_188;
  Result local_180;
  int32 local_16c;
  undefined1 local_168 [4];
  int shape_id;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *local_158;
  int local_150;
  undefined1 local_148 [8];
  iterator __end2;
  undefined1 local_128 [8];
  iterator __begin2;
  btree_set<int,_std::less<int>,_std::allocator<int>,_256> *__range2;
  Options *local_108;
  function<bool_(S2Shape_*,_const_Vector3<double>_&)> local_100;
  undefined1 local_e0 [8];
  btree_set<int,_std::less<int>,_std::allocator<int>,_256> shape_ids;
  S2LogMessage local_90;
  S2LogMessageVoidify local_7a;
  byte local_79;
  S2LogMessage local_78;
  S2LogMessageVoidify local_65 [20];
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  Result local_38;
  S1ChordAngle local_28;
  Options *local_20;
  Options *options_local;
  Target *target_local;
  S2ClosestEdgeQueryBase<S2MaxDistance> *this_local;
  
  this->target_ = target;
  this->options_ = options;
  local_20 = options;
  options_local = (Options *)target;
  target_local = (Target *)this;
  gtl::
  dense_hash_set<s2shapeutil::ShapeEdgeId,_s2shapeutil::ShapeEdgeIdHash,_std::equal_to<s2shapeutil::ShapeEdgeId>,_std::allocator<s2shapeutil::ShapeEdgeId>_>
  ::clear(&this->tested_edges_);
  local_28.length2_ = (double)Options::max_distance(local_20);
  (this->distance_limit_).distance_.length2_ = local_28.length2_;
  Result::Result(&local_38);
  (this->result_singleton_).distance_.distance_.length2_ =
       (double)local_38.distance_.distance_.length2_;
  (this->result_singleton_).shape_id_ = local_38.shape_id_;
  (this->result_singleton_).edge_id_ = local_38.edge_id_;
  bVar4 = std::
          vector<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>_>
          ::empty(&this->result_vector_);
  local_51 = 0;
  if (((bVar4 ^ 0xffU) & 1) != 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
               ,0x22e,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar7 = S2LogMessage::stream(&local_50);
    poVar7 = std::operator<<(poVar7,"Check failed: result_vector_.empty() ");
    S2LogMessageVoidify::operator&(&local_39,poVar7);
  }
  if ((local_51 & 1) == 0) {
    bVar4 = gtl::internal_btree::
            btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>_>
            ::empty((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MaxDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MaxDistance>::Result>,_256,_false>_>_>
                     *)&this->result_set_);
    local_79 = 0;
    if (((bVar4 ^ 0xffU) & 1) != 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x22f,kFatal,(ostream *)&std::cerr);
      local_79 = 1;
      poVar7 = S2LogMessage::stream(&local_78);
      poVar7 = std::operator<<(poVar7,"Check failed: result_set_.empty() ");
      S2LogMessageVoidify::operator&(local_65,poVar7);
    }
    if ((local_79 & 1) != 0) {
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_78);
    }
    iVar5 = (**(code **)((long)(options_local->max_distance_).distance_.length2_ + 0x40))();
    if (iVar5 < 0) {
      S2FatalLogMessage::S2FatalLogMessage
                ((S2FatalLogMessage *)&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                 ,0x230,kFatal,(ostream *)&std::cerr);
      poVar7 = S2LogMessage::stream(&local_90);
      poVar7 = std::operator<<(poVar7,"Check failed: (target->max_brute_force_index_size()) >= (0) "
                              );
      S2LogMessageVoidify::operator&(&local_7a,poVar7);
      S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_90);
    }
    SVar10.distance_.length2_ = (S1ChordAngle)(this->distance_limit_).distance_.length2_;
    SVar9 = S2MaxDistance::Zero();
    bVar4 = ::operator==(SVar10,SVar9);
    if (!bVar4) {
      iVar5 = Options::max_results(local_20);
      local_229 = false;
      if (iVar5 == 0x7fffffff) {
        SVar10 = Options::max_distance(local_20);
        SVar9 = S2MaxDistance::Infinity();
        local_229 = ::operator==(SVar10,SVar9);
      }
      if (local_229 != false) {
        this_00 = &shape_ids.
                   super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                   .
                   super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                   .tree_.size_;
        S2LogMessage::S2LogMessage
                  ((S2LogMessage *)this_00,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2closest_edge_query_base.h"
                   ,0x235,kWarning,(ostream *)&std::cerr);
        poVar7 = S2LogMessage::stream((S2LogMessage *)this_00);
        std::operator<<(poVar7,"Returning all edges (max_results/max_distance not set)");
        S2LogMessage::~S2LogMessage
                  ((S2LogMessage *)
                   &shape_ids.
                    super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .
                    super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                    .tree_.size_);
      }
      bVar4 = Options::include_interiors(local_20);
      if (bVar4) {
        gtl::btree_set<int,_std::less<int>,_std::allocator<int>,_256>::btree_set
                  ((btree_set<int,_std::less<int>,_std::allocator<int>,_256> *)local_e0);
        pOVar3 = options_local;
        pSVar1 = this->index_;
        local_108 = local_20;
        __range2 = (btree_set<int,_std::less<int>,_std::allocator<int>,_256> *)local_e0;
        std::function<bool(S2Shape*,Vector3<double>const&)>::
        function<S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdgesInternal(S2DistanceTarget<S2MaxDistance>*,S2ClosestEdgeQueryBase<S2MaxDistance>::Options_const&)::_lambda(S2Shape*,Vector3<double>const&)_1_,void>
                  ((function<bool(S2Shape*,Vector3<double>const&)> *)&local_100,
                   (anon_class_16_2_a418c4ed *)&__range2);
        (**(code **)((long)(pOVar3->max_distance_).distance_.length2_ + 0x30))
                  (pOVar3,pSVar1,&local_100);
        std::function<bool_(S2Shape_*,_const_Vector3<double>_&)>::~function(&local_100);
        __begin2._8_8_ = local_e0;
        iVar11 = gtl::internal_btree::
                 btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                 ::begin((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                          *)__begin2._8_8_);
        __end2._8_8_ = iVar11.node;
        __begin2.node._0_4_ = iVar11.position;
        local_128 = (undefined1  [8])__end2._8_8_;
        iVar11 = gtl::internal_btree::
                 btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                 ::end((btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>_>
                        *)__begin2._8_8_);
        local_158 = iVar11.node;
        local_150 = iVar11.position;
        local_148 = (undefined1  [8])local_158;
        __end2.node._0_4_ = local_150;
        while( true ) {
          gtl::internal_btree::
          btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
          ::
          btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*,_0>
                    ((btree_iterator<const_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_const_int_&,_const_int_*>
                      *)local_168,
                     (btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                      *)local_148);
          bVar4 = gtl::internal_btree::
                  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                  ::operator!=((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                                *)local_128,(const_iterator *)local_168);
          if (!bVar4) break;
          piVar8 = gtl::internal_btree::
                   btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                   ::operator*((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                                *)local_128);
          local_16c = *piVar8;
          local_188.length2_ = (double)S2MaxDistance::Zero();
          Result::Result(&local_180,(S2MaxDistance)local_188.length2_,local_16c,-1);
          AddResult(this,&local_180);
          gtl::internal_btree::
          btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
          ::operator++((btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>,_int_&,_int_*>
                        *)local_128);
        }
        local_190.distance_.length2_ = (S1ChordAngle)(this->distance_limit_).distance_.length2_;
        SStack_198 = S2MaxDistance::Zero();
        bVar4 = ::operator==(local_190,SStack_198);
        local_19c = (uint)bVar4;
        gtl::btree_set<int,_std::less<int>,_std::allocator<int>,_256>::~btree_set
                  ((btree_set<int,_std::less<int>,_std::allocator<int>,_256> *)local_e0);
        if (local_19c != 0) {
          return;
        }
      }
      local_1a8.length2_ = (double)Options::max_error(local_20);
      local_1b0 = (double)S1ChordAngle::Zero();
      bVar4 = ::operator==(local_1a8,(S1ChordAngle)local_1b0);
      local_292 = 0;
      if (!bVar4) {
        pTVar2 = this->target_;
        local_1b8 = (double)Options::max_error(local_20);
        iVar5 = (*pTVar2->_vptr_S2DistanceTarget[7])(pTVar2,&local_1b8);
        local_292 = (byte)iVar5;
      }
      local_19d = local_292 & 1;
      local_2a1 = false;
      if (local_19d != 0) {
        SVar10.distance_.length2_ = (S1ChordAngle)(this->distance_limit_).distance_.length2_;
        SVar9 = S2MaxDistance::Infinity();
        bVar4 = ::operator==(SVar10,SVar9);
        local_2a2 = true;
        if (!bVar4) {
          SVar9 = S2MaxDistance::Zero();
          SVar10.distance_.length2_ = (S1ChordAngle)(this->distance_limit_).distance_.length2_;
          delta = Options::max_error(local_20);
          SVar10 = ::operator-(SVar10,(S1ChordAngle)delta.length2_);
          local_2a2 = ::operator<(SVar9,SVar10);
        }
        local_2a1 = local_2a2;
      }
      this->use_conservative_cell_distance_ = local_2a1;
      iVar5 = (*this->target_->_vptr_S2DistanceTarget[8])();
      iVar5 = iVar5 + 1;
      if ((this->index_num_edges_limit_ < iVar5) &&
         (this->index_num_edges_limit_ <= this->index_num_edges_)) {
        iVar6 = s2shapeutil::CountEdgesUpTo<S2ShapeIndex>(this->index_,iVar5);
        this->index_num_edges_ = iVar6;
        this->index_num_edges_limit_ = iVar5;
      }
      bVar4 = Options::use_brute_force(local_20);
      if ((bVar4) || (this->index_num_edges_ < iVar5)) {
        this->avoid_duplicates_ = false;
        FindClosestEdgesBruteForce(this);
      }
      else {
        local_2a3 = false;
        if ((local_19d & 1) != 0) {
          iVar5 = Options::max_results(local_20);
          local_2a3 = 1 < iVar5;
        }
        this->avoid_duplicates_ = local_2a3;
        FindClosestEdgesOptimized(this);
      }
    }
    return;
  }
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdgesInternal(
    Target* target, const Options& options) {
  target_ = target;
  options_ = &options;

  tested_edges_.clear();
  distance_limit_ = options.max_distance();
  result_singleton_ = Result();
  S2_DCHECK(result_vector_.empty());
  S2_DCHECK(result_set_.empty());
  S2_DCHECK_GE(target->max_brute_force_index_size(), 0);
  if (distance_limit_ == Distance::Zero()) return;

  if (options.max_results() == Options::kMaxMaxResults &&
      options.max_distance() == Distance::Infinity()) {
    S2_LOG(WARNING) << "Returning all edges (max_results/max_distance not set)";
  }

  if (options.include_interiors()) {
    gtl::btree_set<int32> shape_ids;
    (void) target->VisitContainingShapes(
        *index_, [&shape_ids, &options](S2Shape* containing_shape,
                                        const S2Point& target_point) {
          shape_ids.insert(containing_shape->id());
          return shape_ids.size() < options.max_results();
        });
    for (int shape_id : shape_ids) {
      AddResult(Result(Distance::Zero(), shape_id, -1));
    }
    if (distance_limit_ == Distance::Zero()) return;
  }

  // If max_error() > 0 and the target takes advantage of this, then we may
  // need to adjust the distance estimates to the priority queue cells to
  // ensure that they are always a lower bound on the true distance.  For
  // example, suppose max_distance == 100, max_error == 30, and we compute the
  // distance to the target from some cell C0 as d(C0) == 80.  Then because
  // the target takes advantage of max_error(), the true distance could be as
  // low as 50.  In order not to miss edges contained by such cells, we need
  // to subtract max_error() from the distance estimates.  This behavior is
  // controlled by the use_conservative_cell_distance_ flag.
  //
  // However there is one important case where this adjustment is not
  // necessary, namely when max_distance() < max_error().  This is because
  // max_error() only affects the algorithm once at least max_results() edges
  // have been found that satisfy the given distance limit.  At that point,
  // max_error() is subtracted from distance_limit_ in order to ensure that
  // any further matches are closer by at least that amount.  But when
  // max_distance() < max_error(), this reduces the distance limit to 0,
  // i.e. all remaining candidate cells and edges can safely be discarded.
  // (Note that this is how IsDistanceLess() and friends are implemented.)
  //
  // Note that Distance::Delta only supports operator==.
  bool target_uses_max_error = (!(options.max_error() == Delta::Zero()) &&
                                target_->set_max_error(options.max_error()));

  // Note that we can't compare max_error() and distance_limit_ directly
  // because one is a Delta and one is a Distance.  Instead we subtract them.
  use_conservative_cell_distance_ = target_uses_max_error &&
      (distance_limit_ == Distance::Infinity() ||
       Distance::Zero() < distance_limit_ - options.max_error());

  // Use the brute force algorithm if the index is small enough.  To avoid
  // spending too much time counting edges when there are many shapes, we stop
  // counting once there are too many edges.  We may need to recount the edges
  // if we later see a target with a larger brute force edge threshold.
  int min_optimized_edges = target_->max_brute_force_index_size() + 1;
  if (min_optimized_edges > index_num_edges_limit_ &&
      index_num_edges_ >= index_num_edges_limit_) {
    index_num_edges_ = s2shapeutil::CountEdgesUpTo(*index_,
                                                   min_optimized_edges);
    index_num_edges_limit_ = min_optimized_edges;
  }

  if (options.use_brute_force() || index_num_edges_ < min_optimized_edges) {
    // The brute force algorithm considers each edge exactly once.
    avoid_duplicates_ = false;
    FindClosestEdgesBruteForce();
  } else {
    // If the target takes advantage of max_error() then we need to avoid
    // duplicate edges explicitly.  (Otherwise it happens automatically.)
    avoid_duplicates_ = (target_uses_max_error && options.max_results() > 1);
    FindClosestEdgesOptimized();
  }
}